

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

bool ConvertIntelHexLine(char *buf,FILE *outFile)

{
  uint uVar1;
  uint dataStart;
  uint slen;
  FILE *outFile_local;
  char *buf_local;
  
  uVar1 = ChompStrlen(buf);
  if ((uVar1 < 0xb) || (0x20b < uVar1)) {
    buf_local._7_1_ = false;
  }
  else if ((uVar1 & 1) == 0) {
    buf_local._7_1_ = false;
  }
  else if ((*buf == ':') && (buf[7] == '0')) {
    if ((buf[8] == '0') || (buf[8] == '1')) {
      buf_local._7_1_ = OutputBin(outFile,buf,9,uVar1 - 2);
    }
    else if ((((buf[8] == '2') || (buf[8] == '3')) || (buf[8] == '4')) || (buf[8] == '5')) {
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
  }
  else {
    buf_local._7_1_ = false;
  }
  return buf_local._7_1_;
}

Assistant:

static bool ConvertIntelHexLine(const char* buf, FILE* outFile)
{
  unsigned int slen = ChompStrlen(buf);
  if ((slen < INTEL_HEX_MIN_LINE_LENGTH) ||
      (slen > INTEL_HEX_MAX_LINE_LENGTH)) {
    return false;
  }

  // line length must be odd
  if (slen % 2 == 0) {
    return false;
  }

  if ((buf[0] != ':') || (buf[7] != '0')) {
    return false;
  }

  unsigned int dataStart = 0;
  if ((buf[8] == '0') || (buf[8] == '1')) {
    dataStart = 9;
  }
  // ignore extra address records
  else if ((buf[8] == '2') || (buf[8] == '3') || (buf[8] == '4') ||
           (buf[8] == '5')) {
    return true;
  } else // unknown record type
  {
    return false;
  }

  // ignore the last two bytes  (checksum)
  return OutputBin(outFile, buf, dataStart, slen - 2);
}